

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O1

int32_t helicsDataBufferFillFromString(HelicsDataBuffer data,char *str)

{
  Message *pMVar1;
  byte *data_00;
  char *in_RCX;
  int32_t iVar2;
  string_view val;
  
  if ((data == (HelicsDataBuffer)0x0) || (*(int *)((long)data + 0x5c) != 0x24ea663f)) {
    pMVar1 = getMessageObj(data,(HelicsError *)0x0);
    data = &pMVar1->data;
    if (pMVar1 == (Message *)0x0) {
      data = (SmallBuffer *)0x0;
    }
  }
  iVar2 = 0;
  if ((SmallBuffer *)data != (SmallBuffer *)0x0) {
    data_00 = (byte *)strlen(str);
    helics::SmallBuffer::reserve((SmallBuffer *)data,(size_t)(data_00 + 8));
    ((SmallBuffer *)data)->bufferSize = (size_t)(data_00 + 8);
    val._M_str = in_RCX;
    val._M_len = (size_t)str;
    helics::detail::convertToBinary((detail *)((SmallBuffer *)data)->heap,data_00,val);
    iVar2 = (int32_t)((SmallBuffer *)data)->bufferSize;
  }
  return iVar2;
}

Assistant:

HELICS_EXPORT int32_t helicsDataBufferFillFromString(HelicsDataBuffer data, const char* str)
{
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        return 0;
    }
    try {
        helics::ValueConverter<std::string_view>::convert(std::string_view(str), *ptr);
        return static_cast<int32_t>(ptr->size());
    }
    catch (const std::bad_alloc&) {
        return 0;
    }
}